

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeGuardCommand.h
# Opt level: O0

cmCommand * __thiscall cmIncludeGuardCommand::Clone(cmIncludeGuardCommand *this)

{
  cmCommand *this_00;
  cmIncludeGuardCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmIncludeGuardCommand((cmIncludeGuardCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmIncludeGuardCommand; }